

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O1

Window * __thiscall
s2polyline_alignment::Window::Upsample
          (Window *__return_storage_ptr__,Window *this,int new_rows,int new_cols)

{
  int iVar1;
  pointer pCVar2;
  ulong uVar3;
  int iVar4;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  allocator_type local_49;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  local_48;
  double local_30;
  double local_28;
  
  if (new_rows < this->rows_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x46,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_48.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish,"Check failed: new_rows >= rows_ ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_48.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish,"Upsampling: New_rows < current_rows",0x23
              );
  }
  else {
    if (this->cols_ <= new_cols) {
      local_30 = (double)this->rows_;
      local_28 = (double)this->cols_;
      std::
      vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::vector(&local_48,(long)new_rows,&local_49);
      if (0 < new_rows) {
        pCVar2 = (this->strides_).
                 super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = 0;
        do {
          iVar4 = (int)(((double)(int)uVar3 + 0.5) / ((double)new_rows / local_30));
          iVar1 = pCVar2[iVar4].end;
          local_48.
          super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].start =
               (int)((double)pCVar2[iVar4].start * ((double)new_cols / local_28) + 0.5);
          local_48.
          super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].end =
               (int)((double)iVar1 * ((double)new_cols / local_28) + 0.5);
          uVar3 = uVar3 + 1;
        } while ((uint)new_rows != uVar3);
      }
      Window(__return_storage_ptr__,&local_48);
      if (local_48.
          super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x47,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_48.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish,"Check failed: new_cols >= cols_ ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_48.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish,"Upsampling: New_cols < current_cols",0x23
              );
  }
  abort();
}

Assistant:

Window Window::Upsample(const int new_rows, const int new_cols) const {
  S2_DCHECK(new_rows >= rows_) << "Upsampling: New_rows < current_rows";
  S2_DCHECK(new_cols >= cols_) << "Upsampling: New_cols < current_cols";
  const double row_scale = static_cast<double>(new_rows) / rows_;
  const double col_scale = static_cast<double>(new_cols) / cols_;
  std::vector<ColumnStride> new_strides(new_rows);
  ColumnStride from_stride;
  for (int row = 0; row < new_rows; ++row) {
    from_stride = strides_[static_cast<int>((row + 0.5) / row_scale)];
    new_strides[row] = {static_cast<int>(col_scale * from_stride.start + 0.5),
                        static_cast<int>(col_scale * from_stride.end + 0.5)};
  }
  return Window(new_strides);
}